

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::MPSegment::Cut
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words,
          size_t max_word_len)

{
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> local_38;
  
  local_38.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Trie::Find(this->dictTrie_->trie_,begin,end,&local_38,max_word_len);
  CalcDP(this,&local_38);
  CutByDag(this,begin,end,&local_38,words);
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector(&local_38);
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin,
           RuneStrArray::const_iterator end,
           vector<WordRange>& words,
           size_t max_word_len = MAX_WORD_LENGTH) const {
    vector<Dag> dags;
    dictTrie_->Find(begin, 
          end, 
          dags,
          max_word_len);
    CalcDP(dags);
    CutByDag(begin, end, dags, words);
  }